

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidgetitemiterator.cpp
# Opt level: O2

void __thiscall
QTreeWidgetItemIteratorPrivate::ensureValidIterator
          (QTreeWidgetItemIteratorPrivate *this,QTreeWidgetItem *itemToBeRemoved)

{
  QTreeWidgetItemIterator *this_00;
  QTreeWidget *this_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  QTreeWidgetItem *pQVar4;
  QTreeWidgetItemIteratorPrivate *this_02;
  QTreeWidgetItem *item;
  long in_FS_OFFSET;
  QTreeWidgetItemIterator local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->q_ptr;
  item = this_00->current;
  if (item != (QTreeWidgetItem *)0x0) {
    pQVar4 = item;
    if (item->par != itemToBeRemoved->par) {
      do {
        item = pQVar4;
        if (item == itemToBeRemoved) break;
        pQVar4 = item->par;
      } while (item->par != (QTreeWidgetItem *)0x0);
    }
    if (item == itemToBeRemoved) {
      pQVar4 = (QTreeWidgetItem *)0x0;
      this_02 = this;
      while ((item != (QTreeWidgetItem *)0x0 && (pQVar4 == (QTreeWidgetItem *)0x0))) {
        pQVar4 = nextSibling(this_02,item);
        item = item->par;
      }
      if (pQVar4 == (QTreeWidgetItem *)0x0) {
        this_00->current = (QTreeWidgetItem *)0x0;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          QList<int>::clear(&(this->m_parentIndex).super_QList<int>);
          return;
        }
        goto LAB_00559853;
      }
      QTreeWidgetItemIterator::QTreeWidgetItemIterator
                (&local_50,pQVar4,
                 (IteratorFlags)
                 (this_00->flags).
                 super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
                 super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i);
      QTreeWidgetItemIterator::operator=(this_00,&local_50);
      QTreeWidgetItemIterator::~QTreeWidgetItemIterator(&local_50);
      bVar1 = QTreeWidgetItemIterator::matchesFlags(this_00,pQVar4);
      item = pQVar4;
      if (!bVar1) {
        QTreeWidgetItemIterator::operator++(this_00);
      }
    }
    pQVar4 = itemToBeRemoved->par;
    if (item->par == pQVar4) {
      if (item->par == (QTreeWidgetItem *)0x0) {
        this_01 = itemToBeRemoved->view;
        iVar2 = QTreeWidget::indexOfTopLevelItem(this_01,itemToBeRemoved);
        iVar3 = QTreeWidget::indexOfTopLevelItem(this_01,item);
      }
      else {
        iVar2 = QTreeWidgetItem::indexOfChild(pQVar4,itemToBeRemoved);
        iVar3 = QTreeWidgetItem::indexOfChild(pQVar4,item);
      }
      if (iVar2 <= iVar3) {
        this->m_currentIndex = this->m_currentIndex + -1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00559853:
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItemIteratorPrivate::ensureValidIterator(const QTreeWidgetItem *itemToBeRemoved)
{
    Q_Q(QTreeWidgetItemIterator);
    Q_ASSERT(itemToBeRemoved);

    if (!q->current) return;
    QTreeWidgetItem *nextItem = q->current;

    // Do not walk to the ancestor to find the other item if they have the same parent.
    if (nextItem->parent() != itemToBeRemoved->parent()) {
        while (nextItem->parent() && nextItem != itemToBeRemoved) {
            nextItem = nextItem->parent();
        }
    }
    // If the item to be removed is an ancestor of the current iterator item,
    // we need to adjust the iterator.
    if (nextItem == itemToBeRemoved) {
        QTreeWidgetItem *parent = nextItem;
        nextItem = nullptr;
        while (parent && !nextItem) {
            nextItem = nextSibling(parent);
            parent = parent->parent();
        }
        if (nextItem) {
            // Ooooh... Set the iterator to the next valid item
            *q = QTreeWidgetItemIterator(nextItem, q->flags);
            if (!(q->matchesFlags(nextItem))) ++(*q);
        } else {
            // set it to null.
            q->current = nullptr;
            m_parentIndex.clear();
            return;
        }
    }
    if (nextItem->parent() == itemToBeRemoved->parent()) {
        // They have the same parent, i.e. we have to adjust the m_currentIndex member of the iterator
        // if the deleted item is to the left of the nextItem.

        QTreeWidgetItem *par = itemToBeRemoved->parent();   // We know they both have the same parent.
        QTreeWidget *tw = itemToBeRemoved->treeWidget();    // ..and widget
        int indexOfItemToBeRemoved = par ? par->indexOfChild(const_cast<QTreeWidgetItem *>(itemToBeRemoved))
            : tw->indexOfTopLevelItem(const_cast<QTreeWidgetItem *>(itemToBeRemoved));
        int indexOfNextItem = par ? par->indexOfChild(nextItem) : tw->indexOfTopLevelItem(nextItem);

        if (indexOfItemToBeRemoved <= indexOfNextItem) {
            // A sibling to the left of us was deleted, adjust the m_currentIndex member of the iterator.
            // Note that the m_currentIndex will be wrong until the item is actually removed!
            m_currentIndex--;
        }
    }
}